

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_success_example.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  int iVar3;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:65:3)>
  NEARGYE_SCOPE_SUCCESS_2;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:38:5)>
  scope_success_1;
  on_success_policy local_250 [2];
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:42:60)>
  scope_success_2;
  fstream file;
  ostream local_230 [512];
  
  std::fstream::fstream(&file);
  std::fstream::open((char *)&file,0x102004);
  std::uncaught_exceptions();
  std::uncaught_exceptions();
  scope_success_2.policy_.ec_ = std::uncaught_exceptions();
  for (iVar3 = -1; iVar3 != 0; iVar3 = iVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[1] inside WITH_SCOPE_SUCCESS");
    std::endl<char,std::char_traits<char>>(poVar2);
    local_250[0].ec_ = std::uncaught_exceptions();
    bVar1 = scope_guard::detail::on_success_policy::should_execute(local_250);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[1] leave WITH_SCOPE_SUCCESS");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  poVar2 = std::operator<<(local_230,"example");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"[1] write to file");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::fstream::close();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  try {
    std::fstream file;
    file.open("test.txt", std::fstream::out | std::fstream::trunc);
    SCOPE_SUCCESS{
      file.close();
      std::cout << "[1] file write success" << std::endl;
    };

    MAKE_SCOPE_SUCCESS(scope_success_1) {
      std::cout << "[1] file write success" << std::endl;
    };

    auto scope_success_2 = scope_guard::make_scope_success([&]() {
      std::cout << "[1] file write success" << std::endl;
    });

    WITH_SCOPE_SUCCESS({ std::cout << "[1] leave WITH_SCOPE_SUCCESS" << std::endl; }) {
      std::cout << "[1] inside WITH_SCOPE_SUCCESS" << std::endl;
    }

    file << "example" << std::endl;
    std::cout << "[1] write to file" << std::endl;
    file.close();

    scope_success_1.dismiss();

    throw std::runtime_error{"error"};

    scope_success_2.dismiss();
  }